

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

int __thiscall Catch::TestCaseTracking::TrackerBase::close(TrackerBase *this,int __fd)

{
  pointer psVar1;
  int iVar2;
  TrackerContext *pTVar3;
  pointer psVar4;
  long lVar5;
  pointer psVar6;
  string local_70;
  ReusableStringStream local_50;
  SourceLineInfo local_38;
  
  pTVar3 = this->m_ctx;
  while ((TrackerBase *)pTVar3->m_currentTracker != this) {
    (*(((TrackerBase *)pTVar3->m_currentTracker)->super_ITracker)._vptr_ITracker[8])();
    pTVar3 = this->m_ctx;
  }
  switch(this->m_runState) {
  case NotStarted:
  case CompletedSuccessfully:
  case Failed:
    ReusableStringStream::ReusableStringStream(&local_50);
    local_38.file =
         "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/test/../third_party/catch/catch.hpp"
    ;
    local_38.line = 0x390a;
    operator<<(local_50.m_oss,&local_38);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_50.m_oss,": Internal Catch2 error: ",0x19);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_50.m_oss,"Illogical state: ",0x11);
    std::ostream::operator<<(local_50.m_oss,this->m_runState);
    std::__cxx11::stringbuf::str();
    throw_logic_error(&local_70);
  case Executing:
    goto switchD_0018d7f8_caseD_1;
  case ExecutingChildren:
    psVar4 = (this->m_children).
             super__Vector_base<std::shared_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar1 = (this->m_children).
             super__Vector_base<std::shared_ptr<Catch::TestCaseTracking::ITracker>,_std::allocator<std::shared_ptr<Catch::TestCaseTracking::ITracker>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    lVar5 = (long)psVar1 - (long)psVar4 >> 6;
    if (0 < lVar5) {
      lVar5 = lVar5 + 1;
      psVar4 = psVar4 + 2;
      do {
        psVar6 = psVar4;
        iVar2 = (*(psVar6[-2].
                   super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->_vptr_ITracker[2])();
        if ((char)iVar2 == '\0') {
          psVar6 = psVar6 + -2;
          goto LAB_0018d8da;
        }
        iVar2 = (*(psVar6[-1].
                   super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->_vptr_ITracker[2])();
        if ((char)iVar2 == '\0') {
          psVar6 = psVar6 + -1;
          goto LAB_0018d8da;
        }
        iVar2 = (*((psVar6->
                   super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr)->_vptr_ITracker[2])();
        if ((char)iVar2 == '\0') goto LAB_0018d8da;
        iVar2 = (*(psVar6[1].
                   super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->_vptr_ITracker[2])();
        if ((char)iVar2 == '\0') {
          psVar6 = psVar6 + 1;
          goto LAB_0018d8da;
        }
        lVar5 = lVar5 + -1;
        psVar4 = psVar6 + 4;
      } while (1 < lVar5);
      psVar4 = psVar6 + 2;
    }
    lVar5 = (long)psVar1 - (long)psVar4 >> 4;
    if (lVar5 == 1) {
LAB_0018d8b5:
      iVar2 = (*((psVar4->
                 super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr)->_vptr_ITracker[2])();
      psVar6 = psVar4;
      if ((char)iVar2 != '\0') {
        psVar6 = psVar1;
      }
    }
    else if (lVar5 == 2) {
LAB_0018d8a3:
      iVar2 = (*((psVar4->
                 super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr)->_vptr_ITracker[2])();
      psVar6 = psVar4;
      if ((char)iVar2 != '\0') {
        psVar4 = psVar4 + 1;
        goto LAB_0018d8b5;
      }
    }
    else {
      psVar6 = psVar1;
      if ((lVar5 == 3) &&
         (iVar2 = (*((psVar4->
                     super___shared_ptr<Catch::TestCaseTracking::ITracker,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr)->_vptr_ITracker[2])(), psVar6 = psVar4, (char)iVar2 != '\0')) {
        psVar4 = psVar4 + 1;
        goto LAB_0018d8a3;
      }
    }
LAB_0018d8da:
    if (psVar6 != psVar1) goto switchD_0018d7f8_caseD_3;
switchD_0018d7f8_caseD_1:
    this->m_runState = CompletedSuccessfully;
switchD_0018d7f8_caseD_3:
    pTVar3 = this->m_ctx;
    pTVar3->m_currentTracker = this->m_parent;
    pTVar3->m_runState = CompletedCycle;
    return (int)pTVar3;
  case NeedsAnotherRun:
    goto switchD_0018d7f8_caseD_3;
  default:
    ReusableStringStream::ReusableStringStream(&local_50);
    local_38.file =
         "/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/test/../third_party/catch/catch.hpp"
    ;
    local_38.line = 0x390d;
    operator<<(local_50.m_oss,&local_38);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_50.m_oss,": Internal Catch2 error: ",0x19);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_50.m_oss,"Unknown state: ",0xf);
    std::ostream::operator<<(local_50.m_oss,this->m_runState);
    std::__cxx11::stringbuf::str();
    throw_logic_error(&local_70);
  }
}

Assistant:

void TrackerBase::close() {

        // Close any still open children (e.g. generators)
        while( &m_ctx.currentTracker() != this )
            m_ctx.currentTracker().close();

        switch( m_runState ) {
            case NeedsAnotherRun:
                break;

            case Executing:
                m_runState = CompletedSuccessfully;
                break;
            case ExecutingChildren:
                if( std::all_of(m_children.begin(), m_children.end(), [](ITrackerPtr const& t){ return t->isComplete(); }) )
                    m_runState = CompletedSuccessfully;
                break;

            case NotStarted:
            case CompletedSuccessfully:
            case Failed:
                CATCH_INTERNAL_ERROR( "Illogical state: " << m_runState );

            default:
                CATCH_INTERNAL_ERROR( "Unknown state: " << m_runState );
        }
        moveToParent();
        m_ctx.completeCycle();
    }